

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

CodeLocation __thiscall
soul::SourceCodeUtilities::findNextOccurrence
          (SourceCodeUtilities *this,CodeLocation *start,char character)

{
  UnicodeChar UVar1;
  UTF8Reader extraout_RDX;
  CodeLocation CVar2;
  undefined1 local_30 [4];
  UnicodeChar c;
  CodeLocation pos;
  char character_local;
  CodeLocation *start_local;
  
  pos.location.data._7_1_ = character;
  CodeLocation::CodeLocation((CodeLocation *)local_30,start);
  do {
    UVar1 = UTF8Reader::operator*((UTF8Reader *)&pos);
    if (UVar1 == (int)pos.location.data._7_1_) {
      CodeLocation::CodeLocation((CodeLocation *)this,(CodeLocation *)local_30);
LAB_003aa36d:
      CodeLocation::~CodeLocation((CodeLocation *)local_30);
      CVar2.location.data = extraout_RDX.data;
      CVar2.sourceCode.object = (SourceCodeText *)this;
      return CVar2;
    }
    if (UVar1 == 0) {
      memset(this,0,0x10);
      CodeLocation::CodeLocation((CodeLocation *)this);
      goto LAB_003aa36d;
    }
    UTF8Reader::operator++((UTF8Reader *)&pos);
  } while( true );
}

Assistant:

CodeLocation SourceCodeUtilities::findNextOccurrence (CodeLocation start, char character)
{
    for (auto pos = start;; ++(pos.location))
    {
        auto c = *(pos.location);

        if (c == static_cast<decltype(c)> (character))
            return pos;

        if (c == 0)
            return {};
    }
}